

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  Ch *pCVar4;
  Stack<rapidjson::CrtAllocator> *pSVar5;
  SizeType length;
  Ch CVar6;
  bool bVar7;
  uint codepoint;
  uint uVar8;
  Ch *pCVar9;
  char *pcVar10;
  byte *pbVar11;
  StackStream<char> stackStream;
  
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
  stackStream.length_ = 0;
  stackStream.stack_ = (Stack<rapidjson::CrtAllocator> *)this;
LAB_0024b048:
  do {
    while( true ) {
      pbVar11 = (byte *)is->current_;
      bVar1 = *pbVar11;
      if (bVar1 == 0x5c) break;
      if (bVar1 == 0x22) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        pSVar5 = stackStream.stack_;
        pcVar10 = (stackStream.stack_)->stackTop_;
        if ((stackStream.stack_)->stackEnd_ == pcVar10 ||
            (long)(stackStream.stack_)->stackEnd_ - (long)pcVar10 < 0) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(stackStream.stack_,1);
          pcVar10 = pSVar5->stackTop_;
        }
        length = stackStream.length_;
        pSVar5->stackTop_ = pcVar10 + 1;
        *pcVar10 = '\0';
        stackStream.length_ = stackStream.length_ + 1;
        if (*(int *)(this + 0x30) == 0) {
          pcVar10 = (stackStream.stack_)->stackTop_;
          (stackStream.stack_)->stackTop_ = pcVar10 + -(ulong)stackStream.length_;
          bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::String(handler,pcVar10 + -(ulong)stackStream.length_,length,true);
          if (!bVar7) {
            sVar3 = is->count_;
            pCVar9 = is->current_;
            pCVar4 = is->buffer_;
            *(undefined4 *)(this + 0x30) = 0x10;
            *(Ch **)(this + 0x38) = pCVar9 + (sVar3 - (long)pCVar4);
          }
        }
        return;
      }
      if (bVar1 < 0x20) {
        pbVar11 = pbVar11 + (is->count_ - (long)is->buffer_);
        if (bVar1 == 0) {
          *(undefined4 *)(this + 0x30) = 0xb;
        }
        else {
          *(undefined4 *)(this + 0x30) = 0xc;
        }
LAB_0024b275:
        *(byte **)(this + 0x38) = pbVar11;
        return;
      }
      CVar6 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
      pSVar5 = stackStream.stack_;
      pCVar9 = (stackStream.stack_)->stackTop_;
      if ((stackStream.stack_)->stackEnd_ == pCVar9 ||
          (long)(stackStream.stack_)->stackEnd_ - (long)pCVar9 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(stackStream.stack_,1);
        pCVar9 = pSVar5->stackTop_;
      }
      pSVar5->stackTop_ = pCVar9 + 1;
      *pCVar9 = CVar6;
      stackStream.length_ = stackStream.length_ + 1;
    }
    pbVar11 = pbVar11 + (is->count_ - (long)is->buffer_);
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    cVar2 = ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>(rapidjson::BasicIStreamWrapper<std::istream>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
            ::escape[(byte)*is->current_];
    if (cVar2 != '\0') {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
      pSVar5 = stackStream.stack_;
      pcVar10 = (stackStream.stack_)->stackTop_;
      if ((stackStream.stack_)->stackEnd_ == pcVar10 ||
          (long)(stackStream.stack_)->stackEnd_ - (long)pcVar10 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(stackStream.stack_,1);
        pcVar10 = pSVar5->stackTop_;
      }
      pSVar5->stackTop_ = pcVar10 + 1;
      *pcVar10 = cVar2;
      stackStream.length_ = stackStream.length_ + 1;
      goto LAB_0024b048;
    }
    if (*is->current_ != 0x75) {
      *(undefined4 *)(this + 0x30) = 10;
      goto LAB_0024b275;
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    codepoint = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>(this,is,(size_t)pbVar11);
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if ((codepoint & 0xfffff800) == 0xd800) {
      if (((codepoint < 0xdc00) && (*is->current_ == '\\')) &&
         (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is),
         *is->current_ == 'u')) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        uVar8 = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>(this,is,(size_t)pbVar11);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        if (0xfffffbff < uVar8 - 0xe000) {
          codepoint = codepoint * 0x400 + uVar8 + 0xfca02400;
          goto LAB_0024b146;
        }
      }
      *(undefined4 *)(this + 0x30) = 9;
      goto LAB_0024b275;
    }
LAB_0024b146:
    UTF8<char>::
    Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
              (&stackStream,codepoint);
  } while( true );
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        RAPIDJSON_ASSERT(s.Peek() == '\"');
        s.Take();  // Skip '\"'

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (RAPIDJSON_UNLIKELY(!success))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }